

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

void pnga_get_proc_index(Integer g_a,Integer iproc,Integer *index)

{
  global_array_t *pgVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  pgVar1 = GA;
  if (GA[g_a + 1000].distr_type - 3U < 2) {
    lVar3 = (long)GA[g_a + 1000].ndim;
    lVar5 = (long)GA[g_a + 1000].nblock[0];
    lVar2 = iproc % lVar5;
    *index = lVar2;
    if (1 < lVar3) {
      lVar4 = 0;
      do {
        iproc = (iproc - lVar2) / (long)(int)lVar5;
        lVar5 = (long)pgVar1[g_a + 1000].nblock[lVar4 + 1];
        lVar2 = iproc % lVar5;
        index[lVar4 + 1] = lVar2;
        lVar4 = lVar4 + 1;
      } while (lVar3 + -1 != lVar4);
    }
  }
  else {
    if (GA[g_a + 1000].distr_type != 2) {
      pnga_error("Global array does not use ScaLAPACK data distribution",0);
      return;
    }
    lVar3 = (long)GA[g_a + 1000].ndim;
    lVar5 = (long)GA[g_a + 1000].nblock[0];
    lVar2 = iproc % lVar5;
    *index = lVar2;
    if (1 < lVar3) {
      lVar4 = 0;
      do {
        iproc = (iproc - lVar2) / (long)(int)lVar5;
        lVar5 = (long)pgVar1[g_a + 1000].nblock[lVar4 + 1];
        lVar2 = iproc % lVar5;
        index[lVar4 + 1] = lVar2;
        lVar4 = lVar4 + 1;
      } while (lVar3 + -1 != lVar4);
    }
  }
  return;
}

Assistant:

void pnga_get_proc_index(Integer g_a, Integer iproc, Integer *index)
{
  Integer ga_handle = GA_OFFSET + g_a;
  if (GA[ga_handle].distr_type == SCALAPACK) {
    gam_find_proc_indices(ga_handle, iproc, index);
  } else if (GA[ga_handle].distr_type == TILED ||
      GA[ga_handle].distr_type == TILED_IRREG) {
    gam_find_tile_proc_indices(ga_handle, iproc, index);
  } else {
    pnga_error("Global array does not use ScaLAPACK data distribution",0);
  }
  return;
}